

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_4x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [16];
  int iVar7;
  bool bVar8;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  __m128i l16;
  __m128i tl16;
  __m128i t16;
  
  auVar6 = *(undefined1 (*) [16])left;
  uVar1 = *(undefined4 *)above;
  t16 = (__m128i)ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),(char)((uint)uVar1 >> 8)),
                                  (ushort)(byte)uVar1) & 0xffffff00ffffff);
  auVar9 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar9._0_4_;
  iVar7 = 0x10;
  auVar9 = _DAT_0042e4a0;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    l16 = (__m128i)pshufb(auVar6,auVar9);
    paeth_8x1_pred(&l16,&t16,&tl16);
    local_78 = auVar9._0_2_;
    sStack_76 = auVar9._2_2_;
    sStack_74 = auVar9._4_2_;
    sStack_72 = auVar9._6_2_;
    sStack_70 = auVar9._8_2_;
    sStack_6e = auVar9._10_2_;
    sStack_6c = auVar9._12_2_;
    sStack_6a = auVar9._14_2_;
    sVar2 = (short)extraout_XMM0_Qa;
    sVar3 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    sVar4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    sVar5 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    *(uint *)dst = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x30)
                            - (0xff < sVar5),
                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qa >> 0x20) - (0xff < sVar4),
                                     CONCAT11((0 < sVar3) * (sVar3 < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                                              (0xff < sVar3),
                                              (0 < sVar2) * (sVar2 < 0x100) * (char)extraout_XMM0_Qa
                                              - (0xff < sVar2))));
    dst = dst + stride;
    auVar9._0_2_ = local_78 + 1;
    auVar9._2_2_ = sStack_76 + 1;
    auVar9._4_2_ = sStack_74 + 1;
    auVar9._6_2_ = sStack_72 + 1;
    auVar9._8_2_ = sStack_70 + 1;
    auVar9._10_2_ = sStack_6e + 1;
    auVar9._12_2_ = sStack_6c + 1;
    auVar9._14_2_ = sStack_6a + 1;
  }
  return;
}

Assistant:

void aom_paeth_predictor_4x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_cvtsi32_si128(((const int *)above)[0]);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  for (int i = 0; i < 16; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    *(int *)dst = _mm_cvtsi128_si32(_mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}